

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::JsonUnitTestResultPrinter::OutputJsonKey
               (ostream *stream,string *element_name,string *name,int value,string *indent,
               bool comma)

{
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var1;
  ostream *poVar2;
  int local_6c;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_6c = value;
  GetReservedOutputAttributesForElement(&local_48,element_name);
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    (local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,name);
  if (_Var1._M_current ==
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    GTestLog::GTestLog((GTestLog *)&local_68,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/beesaferoot[P]beesafe/build_O1/_deps/googletest-src/googletest/src/gtest.cc"
                       ,0x1200);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Condition std::find(allowed_names.begin(), allowed_names.end(), name) != allowed_names.end() failed. "
               ,0x65);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Key \"",5);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(name->_M_dataplus)._M_p,name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" is not allowed for value \"",0x1c)
    ;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(element_name->_M_dataplus)._M_p,element_name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\".",2);
    GTestLog::~GTestLog((GTestLog *)&local_68);
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,(indent->_M_dataplus)._M_p,indent->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"",1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\": ",3);
  StreamableToString<int>(&local_68,&local_6c);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,local_68._M_dataplus._M_p,local_68._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (comma) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,",\n",2);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OutputJsonKey(
    std::ostream* stream, const std::string& element_name,
    const std::string& name, int value, const std::string& indent, bool comma) {
  const std::vector<std::string>& allowed_names =
      GetReservedOutputAttributesForElement(element_name);

  GTEST_CHECK_(std::find(allowed_names.begin(), allowed_names.end(), name) !=
               allowed_names.end())
      << "Key \"" << name << "\" is not allowed for value \"" << element_name
      << "\".";

  *stream << indent << "\"" << name << "\": " << StreamableToString(value);
  if (comma) *stream << ",\n";
}